

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O0

xmlGlobalStatePtr xmlGetThreadLocalStorage(int allowFailure)

{
  undefined8 local_18;
  xmlGlobalState *gs;
  int allowFailure_local;
  
  xmlInitParser();
  local_18 = (xmlGlobalStatePtr)pthread_getspecific(globalkey);
  if (local_18 == (xmlGlobalStatePtr)0x0) {
    local_18 = xmlNewGlobalState(allowFailure);
  }
  return local_18;
}

Assistant:

static xmlGlobalStatePtr
xmlGetThreadLocalStorage(int allowFailure) {
    xmlGlobalState *gs;

    (void) allowFailure;

    xmlInitParser();

#ifdef USE_TLS
    gs = &globalState;
    if (gs->initialized == 0)
        xmlInitGlobalState(gs);
#elif defined(HAVE_POSIX_THREADS)
    gs = (xmlGlobalState *) pthread_getspecific(globalkey);
    if (gs == NULL)
        gs = xmlNewGlobalState(allowFailure);
#elif defined(HAVE_WIN32_THREADS)
    gs = (xmlGlobalState *) TlsGetValue(globalkey);
    if (gs == NULL)
        gs = xmlNewGlobalState(allowFailure);
#else
    gs = NULL;
#endif

    return(gs);
}